

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamWriterPrivate::doWriteToDevice(QXmlStreamWriterPrivate *this,QStringView s)

{
  long lVar1;
  QUtf8StringView s_00;
  bool bVar2;
  QBasicUtf8StringView<false> *this_00;
  storage_type_conflict *in_RDX;
  qsizetype in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QStringView QVar3;
  char *end;
  qsizetype chunkSize;
  qsizetype MaxChunkSize;
  State state;
  char buffer [1536];
  undefined4 in_stack_fffffffffffff928;
  Flag in_stack_fffffffffffff92c;
  State *in_stack_fffffffffffff930;
  undefined8 in_stack_fffffffffffff938;
  QFlagsStorage<QStringConverterBase::Flag> f;
  storage_type *in_stack_fffffffffffff960;
  qsizetype in_stack_fffffffffffff968;
  qsizetype local_680;
  storage_type_conflict *local_678;
  qsizetype local_660 [2];
  longlong local_650;
  QStringView local_648;
  undefined1 local_638 [8];
  long local_630;
  undefined1 local_608 [808];
  State *in_stack_fffffffffffffd20;
  QStringView in_stack_fffffffffffffd28;
  
  f.i = (Int)((ulong)in_stack_fffffffffffff938 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_650 = 0x200;
  local_648.m_size = in_RSI;
  local_648.m_data = in_RDX;
  memset(local_608,0xaa,0x600);
  memset(local_638,0xaa,0x30);
  QFlags<QStringConverterBase::Flag>::QFlags
            (&in_stack_fffffffffffff930->flags,in_stack_fffffffffffff92c);
  QStringConverterBase::State::State(in_stack_fffffffffffff930,(Flags)f.i);
  while( true ) {
    bVar2 = QStringView::isEmpty((QStringView *)0x64d865);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    local_660[0] = QStringView::size(&local_648);
    std::min<long_long>(local_660,&local_650);
    QVar3 = QStringView::first((QStringView *)
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                               0x64d8ba);
    this_00 = (QBasicUtf8StringView<false> *)
              QUtf8::convertFromUnicode
                        (in_stack_fffffffffffff960,in_stack_fffffffffffffd28,
                         in_stack_fffffffffffffd20);
    QBasicUtf8StringView<false>::QBasicUtf8StringView<char,_true>
              (this_00,(char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
               (char *)0x64d90b);
    s_00.m_size = in_stack_fffffffffffff968;
    s_00.m_data = in_stack_fffffffffffff960;
    doWriteToDevice((QXmlStreamWriterPrivate *)QVar3.m_size,s_00);
    QVar3 = QStringView::sliced((QStringView *)QVar3.m_data,QVar3.m_size);
    local_680 = QVar3.m_size;
    local_648.m_size = local_680;
    local_678 = QVar3.m_data;
    local_648.m_data = local_678;
  }
  if (0 < local_630) {
    *(ushort *)(in_RDI + 0x78) = *(ushort *)(in_RDI + 0x78) & 0xffbf | 0x40;
  }
  QStringConverterBase::State::~State((State *)0x64d9ac);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriterPrivate::doWriteToDevice(QStringView s)
{
    constexpr qsizetype MaxChunkSize = 512;
    char buffer [3 * MaxChunkSize];
    QStringEncoder::State state;
    while (!s.isEmpty()) {
        const qsizetype chunkSize = std::min(s.size(), MaxChunkSize);
        char *end = QUtf8::convertFromUnicode(buffer, s.first(chunkSize), &state);
        doWriteToDevice(QUtf8StringView{buffer, end});
        s = s.sliced(chunkSize);
    }
    if (state.remainingChars > 0)
        hasEncodingError = true;
}